

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

void xmlTextReaderFreeNode(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  xmlNodePtr cur_00;
  xmlParserCtxtPtr pxVar1;
  int iVar2;
  xmlElementType xVar3;
  xmlDeregisterNodeFunc *pp_Var4;
  xmlChar *pxVar5;
  xmlDictPtr dict;
  
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = reader->ctxt->dict;
  }
  xVar3 = cur->type;
  if (xVar3 == XML_ATTRIBUTE_NODE) {
    xmlTextReaderFreeProp(reader,(xmlAttrPtr)cur);
    return;
  }
  if (xVar3 == XML_NAMESPACE_DECL) {
    xmlFreeNs((xmlNsPtr)cur);
    return;
  }
  if (xVar3 == XML_DTD_NODE) {
    xmlFreeDtd((xmlDtdPtr)cur);
    return;
  }
  cur_00 = cur->children;
  if (xVar3 != XML_ENTITY_REF_NODE && cur_00 != (xmlNodePtr)0x0) {
    if (cur_00->parent == cur) {
      xmlTextReaderFreeNodeList(reader,cur_00);
    }
    cur->children = (_xmlNode *)0x0;
  }
  if (__xmlRegisterCallbacks != 0) {
    pp_Var4 = __xmlDeregisterNodeDefaultValue();
    if (*pp_Var4 != (xmlDeregisterNodeFunc)0x0) {
      pp_Var4 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var4)(cur);
    }
  }
  if (((cur->type < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
      ((0x180002U >> (cur->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
     (cur->properties != (xmlAttrPtr)0x0)) {
    xmlTextReaderFreePropList(reader,cur->properties);
  }
  pxVar5 = cur->content;
  if ((_xmlAttr **)pxVar5 == &cur->properties) {
LAB_0019613f:
    xVar3 = cur->type;
  }
  else {
    xVar3 = cur->type;
    if (((XML_XINCLUDE_END < xVar3) ||
        ((0x180022U >> (xVar3 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
       (pxVar5 != (xmlChar *)0x0)) {
      if (dict != (xmlDictPtr)0x0) {
        iVar2 = xmlDictOwns(dict,pxVar5);
        if (iVar2 != 0) goto LAB_0019613f;
        pxVar5 = cur->content;
      }
      (*xmlFree)(pxVar5);
      goto LAB_0019613f;
    }
  }
  if (((xVar3 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
      ((0x180002U >> (xVar3 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
     (cur->nsDef != (xmlNsPtr)0x0)) {
    xmlFreeNsList(cur->nsDef);
    xVar3 = cur->type;
  }
  if (((xVar3 == XML_TEXT_NODE) || (xVar3 == XML_COMMENT_NODE)) ||
     (pxVar5 = cur->name, pxVar5 == (xmlChar *)0x0)) goto LAB_00196199;
  if (dict == (xmlDictPtr)0x0) {
LAB_0019618a:
    (*xmlFree)(pxVar5);
  }
  else {
    iVar2 = xmlDictOwns(dict,pxVar5);
    if (iVar2 == 0) {
      pxVar5 = cur->name;
      goto LAB_0019618a;
    }
  }
  xVar3 = cur->type;
LAB_00196199:
  if ((((xVar3 | XML_ATTRIBUTE_NODE) == XML_TEXT_NODE) &&
      (pxVar1 = reader->ctxt, pxVar1 != (xmlParserCtxtPtr)0x0)) &&
     (iVar2 = pxVar1->freeElemsNr, iVar2 < 100)) {
    cur->next = pxVar1->freeElems;
    pxVar1->freeElems = cur;
    pxVar1->freeElemsNr = iVar2 + 1;
    return;
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

static void
xmlTextReaderFreeNode(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlTextReaderFreeProp(reader, (xmlAttrPtr) cur);
	return;
    }

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	if (cur->children->parent == cur)
	    xmlTextReaderFreeNodeList(reader, cur->children);
	cur->children = NULL;
    }

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->properties != NULL))
	xmlTextReaderFreePropList(reader, cur->properties);
    if ((cur->content != (xmlChar *) &(cur->properties)) &&
        (cur->type != XML_ELEMENT_NODE) &&
	(cur->type != XML_XINCLUDE_START) &&
	(cur->type != XML_XINCLUDE_END) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	DICT_FREE(cur->content);
    }
    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->nsDef != NULL))
	xmlFreeNsList(cur->nsDef);

    /*
     * we don't free names here they are interned now
     */
    if ((cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_TEXT_NODE)) &&
	(reader != NULL) && (reader->ctxt != NULL) &&
	(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	cur->next = reader->ctxt->freeElems;
	reader->ctxt->freeElems = cur;
	reader->ctxt->freeElemsNr++;
    } else {
	xmlFree(cur);
    }
}